

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O2

bool __thiscall
Assimp::DefaultLogger::attachStream(DefaultLogger *this,LogStream *pStream,uint severity)

{
  LogStreamInfo *pLVar1;
  pointer ppLVar2;
  uint uVar3;
  LogStreamInfo *pInfo;
  
  if (pStream != (LogStream *)0x0) {
    uVar3 = 0xf;
    if (severity != 0) {
      uVar3 = severity;
    }
    ppLVar2 = (this->m_StreamArray).
              super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      if (ppLVar2 ==
          (this->m_StreamArray).
          super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pInfo = (LogStreamInfo *)operator_new(0x10);
        pInfo->m_uiErrorSeverity = uVar3;
        pInfo->m_pStream = pStream;
        std::vector<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>::push_back
                  (&this->m_StreamArray,&pInfo);
        goto LAB_003a55f8;
      }
      pLVar1 = *ppLVar2;
      ppLVar2 = ppLVar2 + 1;
    } while (pLVar1->m_pStream != pStream);
    pLVar1->m_uiErrorSeverity = pLVar1->m_uiErrorSeverity | uVar3;
  }
LAB_003a55f8:
  return pStream != (LogStream *)0x0;
}

Assistant:

bool DefaultLogger::attachStream( LogStream *pStream, unsigned int severity ) {
    if ( nullptr == pStream ) {
        return false;
    }

    if (0 == severity)  {
        severity = Logger::Info | Logger::Err | Logger::Warn | Logger::Debugging;
    }

    for ( StreamIt it = m_StreamArray.begin();
        it != m_StreamArray.end();
        ++it )
    {
        if ( (*it)->m_pStream == pStream ) {
            (*it)->m_uiErrorSeverity |= severity;
            return true;
        }
    }

    LogStreamInfo *pInfo = new LogStreamInfo( severity, pStream );
    m_StreamArray.push_back( pInfo );
    return true;
}